

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::clearEkkData(HEkk *this)

{
  HEkk *in_RDI;
  BadBasisChangeReason in_stack_0000003c;
  HEkk *in_stack_00000040;
  
  clearEkkDataInfo(in_RDI);
  in_RDI->model_status_ = kMin;
  in_RDI->simplex_in_scaled_space_ = false;
  HighsSparseMatrix::clear((HighsSparseMatrix *)in_RDI);
  HighsSparseMatrix::clear((HighsSparseMatrix *)in_RDI);
  in_RDI->cost_scale_ = 1.0;
  in_RDI->iteration_count_ = 0;
  in_RDI->dual_simplex_cleanup_level_ = 0;
  in_RDI->dual_simplex_phase1_cleanup_level_ = 0;
  in_RDI->previous_iteration_cycling_detected = -0x7fffffff;
  in_RDI->solve_bailout_ = false;
  in_RDI->called_return_from_solve_ = false;
  in_RDI->exit_algorithm_ = kNone;
  in_RDI->return_primal_solution_status_ = 0;
  in_RDI->return_dual_solution_status_ = 0;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x767730);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767741);
  clearRayRecords(in_RDI);
  in_RDI->build_synthetic_tick_ = 0.0;
  in_RDI->total_synthetic_tick_ = 0.0;
  in_RDI->debug_solve_call_num_ = 0;
  in_RDI->debug_basis_id_ = 0;
  in_RDI->time_report_ = false;
  in_RDI->debug_initial_build_synthetic_tick_ = 0;
  in_RDI->debug_solve_report_ = false;
  in_RDI->debug_iteration_report_ = false;
  in_RDI->debug_basis_report_ = false;
  in_RDI->debug_dual_feasible = false;
  in_RDI->debug_max_relative_dual_steepest_edge_weight_error = 0.0;
  clearBadBasisChange(in_stack_00000040,in_stack_0000003c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x7677ca);
  return;
}

Assistant:

void HEkk::clearEkkData() {
  // Clears Ekk-specific data scalars and vectors. Doesn't clear
  // status, as this is done elsewhere
  //
  // Doesn't clear the LP, simplex NLA or simplex basis as part of
  // clearing Ekk data, so that the simplex basis and HFactor instance
  // are maintained
  //
  // analysis_; No clear yet

  this->clearEkkDataInfo();
  model_status_ = HighsModelStatus::kNotset;
  // random_; Has no data

  this->simplex_in_scaled_space_ = false;
  this->ar_matrix_.clear();
  this->scaled_a_matrix_.clear();

  this->cost_scale_ = 1;
  this->iteration_count_ = 0;
  this->dual_simplex_cleanup_level_ = 0;
  this->dual_simplex_phase1_cleanup_level_ = 0;

  this->previous_iteration_cycling_detected = -kHighsIInf;

  this->solve_bailout_ = false;
  this->called_return_from_solve_ = false;
  this->exit_algorithm_ = SimplexAlgorithm::kNone;
  this->return_primal_solution_status_ = 0;
  this->return_dual_solution_status_ = 0;

  this->proof_index_.clear();
  this->proof_value_.clear();

  this->clearRayRecords();

  this->build_synthetic_tick_ = 0.0;
  this->total_synthetic_tick_ = 0.0;

  // Clear values used for debugging
  this->debug_solve_call_num_ = 0;
  this->debug_basis_id_ = 0;
  this->time_report_ = false;
  this->debug_initial_build_synthetic_tick_ = 0;
  this->debug_solve_report_ = false;
  this->debug_iteration_report_ = false;
  this->debug_basis_report_ = false;
  this->debug_dual_feasible = false;
  this->debug_max_relative_dual_steepest_edge_weight_error = 0;

  clearBadBasisChange();

  this->primal_phase1_dual_.clear();
}